

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O2

int __thiscall deci::ast_unary_t::Generate(ast_unary_t *this,ostream *output,int pc)

{
  int iVar1;
  ostream *poVar2;
  
  iVar1 = (*this->chain->_vptr_ast_item_t[2])();
  poVar2 = std::operator<<(output,"unr ");
  poVar2 = std::operator<<(poVar2,(string *)&this->identifier);
  std::endl<char,std::char_traits<char>>(poVar2);
  return iVar1 + 1;
}

Assistant:

int ast_unary_t::Generate(std::ostream& output, int pc) const {
    pc = this->chain->Generate(output, pc);
    output << "unr " << this->identifier << std::endl;
    return pc + 1;
  }